

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O1

void __thiscall
duckdb::ParquetReader::ParquetReader
          (ParquetReader *this,ClientContext *context_p,OpenFileInfo *file_p,
          ParquetOptions *parquet_options_p,
          shared_ptr<duckdb::ParquetFileMetadataCache,_true> *metadata_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  shared_ptr<duckdb::ExtendedOpenFileInfo,_true> *this_00;
  unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
  *this_01;
  shared_ptr<duckdb::EncryptionUtil,_true> *this_02;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer pcVar4;
  element_type *peVar5;
  pointer pPVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  ParquetFileMetadataCache *__tmp_2;
  Allocator *pAVar10;
  pointer pCVar11;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var12;
  iterator iVar13;
  string *__args;
  ClientContext *context;
  DBConfig *pDVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  time_t tVar16;
  ParquetFileMetadataCache *pPVar17;
  type pCVar18;
  type pEVar19;
  ObjectCache *this_03;
  NotImplementedException *this_04;
  ParquetEncryptionConfig *__tmp;
  pointer *__ptr;
  FileOpenFlags flags;
  Value metadata_cache;
  shared_ptr<const_duckdb::ParquetEncryptionConfig,_true> local_128;
  undefined1 local_118 [40];
  optional_idx local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [80];
  _Alloc_hider local_88;
  undefined1 local_80 [32];
  undefined1 local_60 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  element_type *local_40;
  undefined8 uStack_38;
  
  local_60._0_8_ = (file_p->path)._M_dataplus._M_p;
  paVar1 = &(file_p->path).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._0_8_ == paVar1) {
    local_50._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_50._8_8_ = *(undefined8 *)((long)&(file_p->path).field_2 + 8);
    local_60._0_8_ = &local_50;
  }
  else {
    local_50._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_60._8_8_ = (file_p->path)._M_string_length;
  (file_p->path)._M_dataplus._M_p = (pointer)paVar1;
  (file_p->path)._M_string_length = 0;
  (file_p->path).field_2._M_local_buf[0] = '\0';
  local_40 = (file_p->extended_info).internal.
             super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uStack_38 = (file_p->extended_info).internal.
              super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  (file_p->extended_info).internal.
  super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (file_p->extended_info).internal.
  super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_88._M_p = (pointer)metadata_p;
  BaseFileReader::BaseFileReader(&this->super_BaseFileReader,(OpenFileInfo *)local_60);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uStack_38 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uStack_38);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._0_8_ != &local_50) {
    operator_delete((void *)local_60._0_8_);
  }
  (this->super_BaseFileReader)._vptr_BaseFileReader = (_func_int **)&PTR__ParquetReader_019d53e8;
  local_d8._48_8_ = &this->fs;
  CachingFileSystem::Get((CachingFileSystem *)local_d8._48_8_,context_p);
  pAVar10 = BufferAllocator::Get(context_p);
  this->allocator = pAVar10;
  (this->metadata).internal.
  super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->metadata).internal.
  super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar9 = parquet_options_p->file_row_number;
  (this->parquet_options).binary_as_string = parquet_options_p->binary_as_string;
  (this->parquet_options).file_row_number = bVar9;
  (this->parquet_options).encryption_config.internal.
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar5 = (parquet_options_p->encryption_config).internal.
           super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var15 = (parquet_options_p->encryption_config).internal.
            super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (parquet_options_p->encryption_config).internal.
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->parquet_options).encryption_config.internal.
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
  (this->parquet_options).encryption_config.internal.
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var15;
  (parquet_options_p->encryption_config).internal.
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->parquet_options).debug_use_openssl = parquet_options_p->debug_use_openssl;
  pPVar6 = (parquet_options_p->schema).
           super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
           .
           super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->parquet_options).schema.
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (parquet_options_p->schema).
       super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
       .
       super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->parquet_options).schema.
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_finish = pPVar6;
  (this->parquet_options).schema.
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (parquet_options_p->schema).
       super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
       .
       super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (parquet_options_p->schema).
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (parquet_options_p->schema).
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (parquet_options_p->schema).
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parquet_options).explicit_cardinality = parquet_options_p->explicit_cardinality;
  this_01 = &this->file_handle;
  (this->file_handle).
  super_unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>._M_t.
  super___uniq_ptr_impl<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::CachingFileHandle_*,_std::default_delete<duckdb::CachingFileHandle>_>
  .super__Head_base<0UL,_duckdb::CachingFileHandle_*,_false>._M_head_impl = (CachingFileHandle *)0x0
  ;
  (this->encryption_util).internal.
  super___shared_ptr<duckdb::EncryptionUtil,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->root_schema).
  super_unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ParquetColumnSchema_*,_std::default_delete<duckdb::ParquetColumnSchema>_>
  .super__Head_base<0UL,_duckdb::ParquetColumnSchema_*,_false>._M_head_impl =
       (ParquetColumnSchema *)0x0;
  (this->encryption_util).internal.
  super___shared_ptr<duckdb::EncryptionUtil,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_d8._72_8_ = &(this->super_BaseFileReader).file;
  flags.lock = READ_LOCK;
  flags.compression = AUTO_DETECT;
  flags._10_6_ = 0;
  flags.flags = local_d8._72_8_;
  CachingFileSystem::OpenFile((CachingFileSystem *)local_e8,(OpenFileInfo *)local_d8._48_8_,flags);
  context = (ClientContext *)local_e8._0_8_;
  local_e8._0_8_ = (CachingFileHandle *)0x0;
  ::std::__uniq_ptr_impl<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>
  ::reset((__uniq_ptr_impl<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>
           *)this_01,(pointer)context);
  uVar7 = local_e8._0_8_;
  if ((CachingFileHandle *)local_e8._0_8_ != (CachingFileHandle *)0x0) {
    CachingFileHandle::~CachingFileHandle((CachingFileHandle *)local_e8._0_8_);
    operator_delete((void *)uVar7);
  }
  pCVar11 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
            ::operator->(this_01);
  bVar9 = CachingFileHandle::CanSeek(pCVar11);
  if (!bVar9) {
    this_04 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_e8._0_8_ = local_d8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e8,
               "Reading parquet files from a FIFO stream is not supported and cannot be efficiently supported since metadata is located at the end of the file. Write the stream to disk first and read from there instead."
               ,"");
    NotImplementedException::NotImplementedException(this_04,(string *)local_e8);
    __cxa_throw(this_04,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_f0.index = 0xffffffffffffffff;
  if ((this->super_BaseFileReader).file.extended_info.internal.
      super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    this_00 = &(this->super_BaseFileReader).file.extended_info;
    shared_ptr<duckdb::ExtendedOpenFileInfo,_true>::operator->(this_00);
    p_Var12 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)shared_ptr<duckdb::ExtendedOpenFileInfo,_true>::operator->(this_00);
    local_e8._0_8_ = (CachingFileHandle *)local_d8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"encryption_key","");
    iVar13 = ::std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(p_Var12,(key_type *)local_e8);
    if ((CachingFileHandle *)local_e8._0_8_ != (CachingFileHandle *)local_d8) {
      operator_delete((void *)local_e8._0_8_);
    }
    if (iVar13.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
        ._M_cur != (__node_type *)0x0) {
      __args = StringValue::Get_abi_cxx11_
                         ((Value *)((long)iVar13.
                                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                                          ._M_cur + 0x28));
      local_e8._0_8_ = (CachingFileHandle *)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<duckdb::ParquetEncryptionConfig,std::allocator<duckdb::ParquetEncryptionConfig>,std::__cxx11::string_const&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8),
                 (ParquetEncryptionConfig **)local_e8,
                 (allocator<duckdb::ParquetEncryptionConfig> *)local_118,__args);
      uVar7 = local_e8._0_8_;
      if ((ExternalFileCache *)local_e8._8_8_ != (ExternalFileCache *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(local_e8._8_8_ + 8) = *(int *)(local_e8._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(local_e8._8_8_ + 8) = *(int *)(local_e8._8_8_ + 8) + 1;
        }
      }
      if ((ExternalFileCache *)local_e8._8_8_ != (ExternalFileCache *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
      }
      (this->parquet_options).encryption_config.internal.
      super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar7;
      p_Var15 = (this->parquet_options).encryption_config.internal.
                super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (this->parquet_options).encryption_config.internal.
      super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_;
      if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
      }
    }
    p_Var12 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)shared_ptr<duckdb::ExtendedOpenFileInfo,_true>::operator->(this_00);
    local_e8._0_8_ = (CachingFileHandle *)local_d8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"footer_size","");
    context = (ClientContext *)local_e8;
    iVar13 = ::std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(p_Var12,(key_type *)context);
    if ((CachingFileHandle *)local_e8._0_8_ != (CachingFileHandle *)local_d8) {
      operator_delete((void *)local_e8._0_8_);
    }
    if (iVar13.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
        ._M_cur != (__node_type *)0x0) {
      context = (ClientContext *)
                UBigIntValue::Get((Value *)((long)iVar13.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                                                  ._M_cur + 0x28));
      optional_idx::optional_idx((optional_idx *)local_e8,(idx_t)context);
      local_f0.index = local_e8._0_8_;
    }
  }
  pDVar14 = DBConfig::GetConfig(context_p);
  this_02 = &this->encryption_util;
  if (((pDVar14->encryption_util).internal.
       super___shared_ptr<duckdb::EncryptionUtil,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
       (element_type *)0x0) || ((this->parquet_options).debug_use_openssl != true)) {
    p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
    p_Var15->_M_use_count = 1;
    p_Var15->_M_weak_count = 1;
    p_Var15->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_019d5580;
    p_Var15[1]._vptr__Sp_counted_base = (_func_int **)&PTR_CreateEncryptionState_019d55d0;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var15->_M_use_count = 2;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
    (this->encryption_util).internal.
    super___shared_ptr<duckdb::EncryptionUtil,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var15 + 1);
    p_Var3 = (this->encryption_util).internal.
             super___shared_ptr<duckdb::EncryptionUtil,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->encryption_util).internal.
    super___shared_ptr<duckdb::EncryptionUtil,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var15;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
  }
  else {
    context = (ClientContext *)&pDVar14->encryption_util;
    shared_ptr<duckdb::EncryptionUtil,_true>::operator=
              (this_02,(shared_ptr<duckdb::EncryptionUtil,_true> *)context);
  }
  peVar2 = *(element_type **)local_88._M_p;
  if (peVar2 != (element_type *)0x0) {
    p_Var15 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88._M_p + 8))->_M_pi;
    local_88._M_p[0] = '\0';
    local_88._M_p[1] = '\0';
    local_88._M_p[2] = '\0';
    local_88._M_p[3] = '\0';
    local_88._M_p[4] = '\0';
    local_88._M_p[5] = '\0';
    local_88._M_p[6] = '\0';
    local_88._M_p[7] = '\0';
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88._M_p + 8))->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->metadata).internal.
    super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2
    ;
    p_Var3 = (this->metadata).internal.
             super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->metadata).internal.
    super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var15;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    goto LAB_01099c33;
  }
  Value::Value((Value *)local_e8,0);
  local_118._0_8_ = (element_type *)(local_118 + 0x10);
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"parquet_metadata_cache","")
  ;
  ClientContext::TryGetCurrentSetting(context_p,(string *)local_118,(Value *)local_e8);
  if ((element_type *)local_118._0_8_ != (element_type *)(local_118 + 0x10)) {
    operator_delete((void *)local_118._0_8_);
  }
  bVar9 = Value::GetValue<bool>((Value *)local_e8);
  if (bVar9) {
    pCVar11 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
              ::operator->(this_01);
    tVar16 = CachingFileHandle::GetLastModifiedTime(pCVar11);
    context = (ClientContext *)ObjectCache::GetObjectCache(context_p);
    ObjectCache::Get<duckdb::ParquetFileMetadataCache>((ObjectCache *)local_118,(string *)context);
    uVar8 = local_118._8_8_;
    uVar7 = local_118._0_8_;
    local_118._0_8_ = (element_type *)0x0;
    local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var15 = (this->metadata).internal.
              super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->metadata).internal.
    super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar7;
    (this->metadata).internal.
    super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
    if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
    }
    if ((this->metadata).internal.
        super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      pPVar17 = shared_ptr<duckdb::ParquetFileMetadataCache,_true>::operator->(&this->metadata);
      if (tVar16 + 10 < pPVar17->read_time) goto LAB_01099c29;
    }
    pAVar10 = this->allocator;
    pCVar18 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
              ::operator*(this_01);
    local_128.internal.
    super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->parquet_options).encryption_config.internal.
         super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_128.internal.
    super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (this->parquet_options).encryption_config.internal.
         super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ._M_pi;
    if (local_128.internal.
        super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_128.internal.
         super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_128.internal.
              super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_128.internal.
         super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_128.internal.
              super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    pEVar19 = shared_ptr<duckdb::EncryptionUtil,_true>::operator*(this_02);
    LoadMetadata((duckdb *)local_118,context_p,pAVar10,pCVar18,&local_128,pEVar19,local_f0);
    uVar8 = local_118._8_8_;
    uVar7 = local_118._0_8_;
    local_118._0_8_ = (element_type *)0x0;
    local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var15 = (this->metadata).internal.
              super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->metadata).internal.
    super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar7;
    (this->metadata).internal.
    super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
    if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
    }
    if (local_128.internal.
        super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_128.internal.
                 super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    this_03 = ObjectCache::GetObjectCache(context_p);
    pcVar4 = (this->super_BaseFileReader).file.path._M_dataplus._M_p;
    local_80._0_8_ = (element_type *)(local_80 + 0x10);
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_80,pcVar4,
               pcVar4 + (this->super_BaseFileReader).file.path._M_string_length);
    local_d8._56_8_ =
         (this->metadata).internal.
         super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_d8._64_8_ =
         (this->metadata).internal.
         super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._64_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._64_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._64_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._64_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._64_8_)->_M_use_count + 1;
      }
    }
    context = (ClientContext *)local_80;
    ObjectCache::Put(this_03,(string *)context,
                     (shared_ptr<duckdb::ObjectCacheEntry,_true> *)(local_d8 + 0x38));
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._64_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._64_8_);
    }
    if ((element_type *)local_80._0_8_ != (element_type *)(local_80 + 0x10)) {
      operator_delete((void *)local_80._0_8_);
    }
  }
  else {
    pAVar10 = this->allocator;
    pCVar18 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
              ::operator*(this_01);
    local_128.internal.
    super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->parquet_options).encryption_config.internal.
         super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_128.internal.
    super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (this->parquet_options).encryption_config.internal.
         super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ._M_pi;
    if (local_128.internal.
        super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_128.internal.
         super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_128.internal.
              super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_128.internal.
         super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_128.internal.
              super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    pEVar19 = shared_ptr<duckdb::EncryptionUtil,_true>::operator*(this_02);
    LoadMetadata((duckdb *)local_118,context_p,pAVar10,pCVar18,&local_128,pEVar19,local_f0);
    uVar8 = local_118._8_8_;
    uVar7 = local_118._0_8_;
    local_118._0_8_ = (element_type *)0x0;
    local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var15 = (this->metadata).internal.
              super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->metadata).internal.
    super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar7;
    (this->metadata).internal.
    super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
    context = context_p;
    if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
      context = context_p;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
    }
    if (local_128.internal.
        super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_128.internal.
                 super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
LAB_01099c29:
  Value::~Value((Value *)local_e8);
LAB_01099c33:
  InitializeSchema(this,context);
  return;
}

Assistant:

ParquetReader::ParquetReader(ClientContext &context_p, OpenFileInfo file_p, ParquetOptions parquet_options_p,
                             shared_ptr<ParquetFileMetadataCache> metadata_p)
    : BaseFileReader(std::move(file_p)), fs(CachingFileSystem::Get(context_p)),
      allocator(BufferAllocator::Get(context_p)), parquet_options(std::move(parquet_options_p)) {
	file_handle = fs.OpenFile(file, FileFlags::FILE_FLAGS_READ);
	if (!file_handle->CanSeek()) {
		throw NotImplementedException(
		    "Reading parquet files from a FIFO stream is not supported and cannot be efficiently supported since "
		    "metadata is located at the end of the file. Write the stream to disk first and read from there instead.");
	}

	// read the extended file open info (if any)
	optional_idx footer_size;
	if (file.extended_info) {
		auto &open_options = file.extended_info->options;
		auto encryption_entry = file.extended_info->options.find("encryption_key");
		if (encryption_entry != open_options.end()) {
			parquet_options.encryption_config =
			    make_shared_ptr<ParquetEncryptionConfig>(StringValue::Get(encryption_entry->second));
		}
		auto footer_entry = file.extended_info->options.find("footer_size");
		if (footer_entry != open_options.end()) {
			footer_size = UBigIntValue::Get(footer_entry->second);
		}
	}
	// set pointer to factory method for AES state
	auto &config = DBConfig::GetConfig(context_p);
	if (config.encryption_util && parquet_options.debug_use_openssl) {
		encryption_util = config.encryption_util;
	} else {
		encryption_util = make_shared_ptr<duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLSFactory>();
	}

	// If metadata cached is disabled
	// or if this file has cached metadata
	// or if the cached version already expired
	if (!metadata_p) {
		Value metadata_cache = false;
		context_p.TryGetCurrentSetting("parquet_metadata_cache", metadata_cache);
		if (!metadata_cache.GetValue<bool>()) {
			metadata = LoadMetadata(context_p, allocator, *file_handle, parquet_options.encryption_config,
			                        *encryption_util, footer_size);
		} else {
			auto last_modify_time = file_handle->GetLastModifiedTime();
			metadata = ObjectCache::GetObjectCache(context_p).Get<ParquetFileMetadataCache>(file.path);
			if (!metadata || (last_modify_time + 10 >= metadata->read_time)) {
				metadata = LoadMetadata(context_p, allocator, *file_handle, parquet_options.encryption_config,
				                        *encryption_util, footer_size);
				ObjectCache::GetObjectCache(context_p).Put(file.path, metadata);
			}
		}
	} else {
		metadata = std::move(metadata_p);
	}
	InitializeSchema(context_p);
}